

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trianglemesh.hpp
# Opt level: O2

vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> * __thiscall
TriangleMesh::loadfromfile
          (vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *__return_storage_ptr__,
          TriangleMesh *this,char *filename)

{
  undefined4 uVar1;
  undefined8 uVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  istream *piVar7;
  Triangle *this_00;
  undefined8 *puVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  vec3f vVar12;
  int indices [3];
  vec2f local_508;
  data_t local_500;
  vector<vec3f,_std::allocator<vec3f>_> vv;
  vector<vec2f,_std::allocator<vec2f>_> vt;
  vector<vec3f,_std::allocator<vec3f>_> vn;
  vector<vec3f,_std::allocator<vec3f>_> v;
  vector<vec2f,_std::allocator<vec2f>_> vvt;
  vector<vec3f,_std::allocator<vec3f>_> vvn;
  string line;
  string cmd;
  char *filename_local;
  stringstream in;
  byte abStack_3a0 [360];
  ifstream fin;
  byte abStack_218 [488];
  
  filename_local = filename;
  github111116::ConsoleLogger::log<char[14],char_const*>
            (&console,(char (*) [14])"Loading mesh:",&filename_local);
  pcVar3 = filename_local;
  sVar6 = strlen(filename_local);
  iVar5 = strcmp(pcVar3 + (sVar6 - 4),".obj");
  if (iVar5 != 0) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar8 = "format must be obj";
    __cxa_throw(puVar8,&char_const*::typeinfo,0);
  }
  std::ifstream::ifstream(&fin,pcVar3,_S_in);
  if ((abStack_218[*(long *)(_fin + -0x18)] & 5) != 0) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar8 = "Can\'t open file";
    __cxa_throw(puVar8,&char_const*::typeinfo,0);
  }
  (__return_storage_ptr__->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  do {
    do {
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&fin,(string *)&line);
      if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
        std::__cxx11::string::~string((string *)&line);
        std::_Vector_base<vec2f,_std::allocator<vec2f>_>::~_Vector_base
                  (&vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>);
        std::_Vector_base<vec3f,_std::allocator<vec3f>_>::~_Vector_base
                  (&vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>);
        std::_Vector_base<vec3f,_std::allocator<vec3f>_>::~_Vector_base
                  (&v.super__Vector_base<vec3f,_std::allocator<vec3f>_>);
        std::ifstream::~ifstream(&fin);
        return __return_storage_ptr__;
      }
      iVar5 = isalpha((int)*line._M_dataplus._M_p);
    } while (iVar5 == 0);
    std::__cxx11::stringstream::stringstream((stringstream *)&in,(string *)&line,_S_out|_S_in);
    cmd._M_dataplus._M_p = (pointer)&cmd.field_2;
    cmd._M_string_length = 0;
    cmd.field_2._M_local_buf[0] = '\0';
    std::operator>>((istream *)&in,(string *)&cmd);
    bVar4 = std::operator==(&cmd,"v");
    if (bVar4) {
      vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)((ulong)vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                              super__Vector_impl_data._M_finish & 0xffffffff00000000);
      operator>>((istream *)&in,(vec3f *)&vv);
      std::vector<vec3f,_std::allocator<vec3f>_>::push_back(&v,(vec3f *)&vv);
    }
    bVar4 = std::operator==(&cmd,"vt");
    if (bVar4) {
      vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      operator>>((istream *)&in,(vec2f *)&vv);
      std::vector<vec2f,_std::allocator<vec2f>_>::push_back(&vt,(value_type *)&vv);
    }
    bVar4 = std::operator==(&cmd,"vn");
    if (bVar4) {
      vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)((ulong)vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                              super__Vector_impl_data._M_finish & 0xffffffff00000000);
      operator>>((istream *)&in,(vec3f *)&vv);
      std::vector<vec3f,_std::allocator<vec3f>_>::push_back(&vn,(vec3f *)&vv);
    }
    bVar4 = std::operator==(&cmd,"f");
    if (bVar4) {
      vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      bVar4 = false;
      while ((abStack_3a0[*(long *)(_in + -0x18)] & 7) == 0) {
        indices[2] = 0;
        indices[0] = 0;
        indices[1] = 0;
        for (lVar11 = 0; lVar11 != 0xc; lVar11 = lVar11 + 4) {
          iVar5 = std::istream::peek();
          if (iVar5 != 0x2f) {
            std::istream::operator>>((istream *)&in,(int *)((long)indices + lVar11));
          }
          iVar5 = std::istream::peek();
          if (iVar5 != 0x2f) break;
          std::istream::get();
        }
        while( true ) {
          iVar5 = std::istream::peek();
          iVar5 = isspace(iVar5);
          if (iVar5 == 0) break;
          std::istream::get();
        }
        if (indices[0] == 0) {
          github111116::ConsoleLogger::log<char[10],std::__cxx11::string>
                    (&console,(char (*) [10])"Obj line:",&line);
          puVar8 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar8 = "error parsing obj";
          __cxa_throw(puVar8,&char_const*::typeinfo,0);
        }
        iVar5 = indices[0];
        if (indices[0] < 0) {
          iVar5 = indices[0] +
                  (int)(((long)v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                              super__Vector_impl_data._M_start) / 0xc) + 1;
        }
        iVar9 = indices[1];
        if ((long)indices._0_8_ < 0) {
          iVar9 = indices[1] +
                  (int)((ulong)((long)vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                               (long)vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 3) + 1;
        }
        iVar10 = indices[2];
        if (indices[2] < 0) {
          iVar10 = indices[2] +
                   (int)(((long)vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                               super__Vector_impl_data._M_start) / 0xc) + 1;
        }
        std::vector<vec3f,_std::allocator<vec3f>_>::push_back
                  (&vv,v.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                       super__Vector_impl_data._M_start + (long)iVar5 + -1);
        if (iVar9 == 0) {
          local_508.x = 0.0;
          local_508.y = 0.0;
        }
        else {
          local_508 = vt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)iVar9 + -1];
        }
        std::vector<vec2f,_std::allocator<vec2f>_>::emplace_back<vec2f>(&vvt,&local_508);
        if (iVar10 == 0) {
          local_508.x = 0.0;
          local_508.y = 1.0;
          local_500 = 0.0;
        }
        else {
          local_508.x = vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)iVar10 + -1].x;
          local_508.y = vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)iVar10 + -1].y;
          local_500 = vn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)iVar10 + -1].z;
        }
        std::vector<vec3f,_std::allocator<vec3f>_>::emplace_back<vec3f>(&vvn,(vec3f *)&local_508);
        bVar4 = (bool)(bVar4 | iVar10 == 0);
      }
      if ((long)vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data
                ._M_finish -
          (long)vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.super__Vector_impl_data
                ._M_start != 0x24) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = "mesh face other than triangle not supported";
        __cxa_throw(puVar8,&char_const*::typeinfo,0);
      }
      vVar12 = operator-(vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                         super__Vector_impl_data._M_start + 1,
                         vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                         super__Vector_impl_data._M_start);
      indices[2] = (int)vVar12.z;
      indices._0_8_ = vVar12._0_8_;
      vVar12 = operator-(vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                         super__Vector_impl_data._M_start + 2,
                         vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                         super__Vector_impl_data._M_start);
      local_500 = vVar12.z;
      local_508 = vVar12._0_8_;
      vVar12 = cross((vec3f *)indices,(vec3f *)&local_508);
      if ((((vVar12.x != 0.0) || (NAN(vVar12.x))) || (vVar12.y != 0.0)) ||
         (((NAN(vVar12.y) || (vVar12.z != 0.0)) || (NAN(vVar12.z))))) {
        this_00 = (Triangle *)operator_new(0xa0);
        Triangle::Triangle(this_00,*vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                           vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                           super__Vector_impl_data._M_start[1],
                           vv.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                           super__Vector_impl_data._M_start[2],
                           *vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                            super__Vector_impl_data._M_start,
                           vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                           super__Vector_impl_data._M_start[1],
                           vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>._M_impl.
                           super__Vector_impl_data._M_start[2],
                           *vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                            super__Vector_impl_data._M_start,
                           vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                           super__Vector_impl_data._M_start[1],
                           vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                           super__Vector_impl_data._M_start[2]);
        indices._0_8_ = this_00;
        std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>::emplace_back<BasicPrimitive*>
                  ((vector<BasicPrimitive*,std::allocator<BasicPrimitive*>> *)__return_storage_ptr__
                   ,(BasicPrimitive **)indices);
        if (bVar4) {
          lVar11 = __dynamic_cast((__return_storage_ptr__->
                                  super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                                  )._M_impl.super__Vector_impl_data._M_finish[-1],
                                  &BasicPrimitive::typeinfo,&Triangle::typeinfo,0);
          uVar2 = *(undefined8 *)(lVar11 + 0x8c);
          *(undefined8 *)(lVar11 + 0x44) = uVar2;
          uVar1 = *(undefined4 *)(lVar11 + 0x94);
          *(undefined4 *)(lVar11 + 0x4c) = uVar1;
          *(undefined8 *)(lVar11 + 0x38) = uVar2;
          *(undefined4 *)(lVar11 + 0x40) = uVar1;
          *(undefined8 *)(lVar11 + 0x2c) = uVar2;
          *(undefined4 *)(lVar11 + 0x34) = uVar1;
        }
      }
      std::_Vector_base<vec2f,_std::allocator<vec2f>_>::~_Vector_base
                (&vvt.super__Vector_base<vec2f,_std::allocator<vec2f>_>);
      std::_Vector_base<vec3f,_std::allocator<vec3f>_>::~_Vector_base
                (&vvn.super__Vector_base<vec3f,_std::allocator<vec3f>_>);
      std::_Vector_base<vec3f,_std::allocator<vec3f>_>::~_Vector_base
                ((_Vector_base<vec3f,_std::allocator<vec3f>_> *)&vv);
    }
    std::__cxx11::string::~string((string *)&cmd);
    std::__cxx11::stringstream::~stringstream((stringstream *)&in);
  } while( true );
}

Assistant:

std::vector<BasicPrimitive*> loadfromfile(const char* filename)
	{
		console.log("Loading mesh:", filename);
		if (strcmp(filename+strlen(filename)-4, ".obj") != 0)
			throw "format must be obj";
		std::ifstream fin(filename);
		if (!fin)
			throw "Can't open file";
		std::vector<BasicPrimitive*> faces;
		std::vector<vec3f> v,vn;
		std::vector<vec2f> vt;
		std::string line;
		// reading file line by line
		while (std::getline(fin, line)) {
			if (isalpha(line[0])) {
				std::stringstream in(line);
				std::string cmd;
				in >> cmd;
				if (cmd == "v") { // vertex coordinate
					vec3f t;
					in >> t;
					v.push_back(t);
				}
				if (cmd == "vt") { // texture coordinate
					vec2f t;
					in >> t;
					vt.push_back(t);
				}
				if (cmd == "vn") { // normal vector
					vec3f t;
					in >> t;
					vn.push_back(t);
				}
				if (cmd == "f") { // polygon face
					std::vector<vec3f> vv, vvn;
					std::vector<vec2f> vvt;
					bool recompute_normal = false;
					while (!in.fail() && !in.eof()) {					
						// code from tungsten ObjLoader::loadFace
						int indices[] = {0, 0, 0};
						for (int i = 0; i < 3; ++i) {
							if (in.peek() != '/')
								in >> indices[i];
							if (in.peek() == '/')
								in.get();
							else
								break;
						}
						while (isspace(in.peek()))
							in.get();
						if (!indices[0]) {
							console.log("Obj line:", line);
							throw "error parsing obj";
						}
						int iv = indices[0];
						int ivt = indices[1];
						int ivn = indices[2];
						if (iv < 0) iv += v.size()+1;
						if (ivt < 0) ivt += vt.size()+1;
						if (ivn < 0) ivn += vn.size()+1;
						vv.push_back(v[iv-1]);
						vvt.push_back(ivt? vt[ivt-1]: vec2f());
						vvn.push_back(ivn? vn[ivn-1]: vec3f(0,1,0));
						recompute_normal |= !ivn;
					}
					if (vv.size() == 3) {
						// ignore triangles of zero surface area
						if (cross(vv[1]-vv[0],vv[2]-vv[0]) != vec3f(0)) {
							faces.push_back(new Triangle(vv[0], vv[1], vv[2], vvt[0], vvt[1], vvt[2], vvn[0], vvn[1], vvn[2]));
							if (recompute_normal)
								dynamic_cast<Triangle*>(faces.back())->recompute_normal();
						}
					}
					else {
						throw "mesh face other than triangle not supported";
					}
				} // end reading face
			}
		}
		return faces;
	}